

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.cpp
# Opt level: O2

void __thiscall MinVR::VRDataIndex::VRDataIndex(VRDataIndex *this,string *serializedData)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  Cxml *pCVar3;
  VRDataIndex *this_00;
  element *peVar4;
  element *this_01;
  allocator<char> local_d1;
  Cxml *local_d0;
  string *local_c8;
  VRDataIndex *local_c0;
  element *local_b8;
  string out;
  string local_90;
  string local_70;
  string local_50;
  
  p_Var1 = &(this->_theIndex)._M_t._M_impl.super__Rb_tree_header;
  (this->_theIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_theIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_theIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_theIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_c8 = (string *)&this->_indexName;
  (this->_theIndex)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_lastDatum)._M_node = (_Base_ptr)0x0;
  std::__cxx11::string::string<std::allocator<char>>(local_c8,"MVR",(allocator<char> *)&out);
  this->_overwrite = 1;
  (this->_linkRegister)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_linkRegister)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var2 = &(this->_linkRegister)._M_t._M_impl.super__Rb_tree_header;
  (this->_linkRegister)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->_linkRegister)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->_linkRegister)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->_linkNeeded = false;
  (this->_lastDatum)._M_node = &p_Var1->_M_header;
  local_c0 = this;
  if (*(serializedData->_M_dataplus)._M_p == '<') {
    local_d0 = (Cxml *)operator_new(0x10);
    Cxml::Cxml(local_d0);
    std::__cxx11::string::string((string *)&local_90,(string *)serializedData);
    pCVar3 = local_d0;
    Cxml::parse_string(local_d0,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    peVar4 = Cxml::get_root_element(pCVar3);
    this_01 = element::get_next_child(peVar4);
    local_b8 = peVar4;
    peVar4 = element::get_next_child(this_01);
    out._M_dataplus._M_p = (pointer)&out.field_2;
    out._M_string_length = 0;
    out.field_2._M_local_buf[0] = '\0';
    while (pCVar3 = local_d0, this_01 != (element *)0x0) {
      element::get_name(this_01);
      std::__cxx11::string::assign((char *)local_c8);
      while (peVar4 != (element *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"/",&local_d1);
        _walkXML(&local_50,local_c0,peVar4,&local_70);
        std::__cxx11::string::operator=((string *)&out,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        peVar4 = element::get_next_child(this_01);
      }
      this_01 = element::get_next_child(local_b8);
      peVar4 = (element *)0x0;
    }
    Cxml::~Cxml(local_d0);
    operator_delete(pCVar3,0x10);
    this_00 = local_c0;
    if (local_c0->_linkNeeded == true) {
      _linkNodes(local_c0);
      _linkContent(this_00);
      this_00->_linkNeeded = false;
    }
    std::__cxx11::string::~string((string *)&out);
  }
  else {
    std::__cxx11::string::_M_assign(local_c8);
  }
  return;
}

Assistant:

VRDataIndex::VRDataIndex(const std::string serializedData)  :
  _indexName("MVR"), _overwrite(1), _linkNeeded(false) {

  _lastDatum = _theIndex.end();

  // If this is just a name, we just need an empty data index with the
  // given name.
  if (serializedData[0] != '<') {
    _indexName = serializedData;
    return;
  }

  // If you're here, the input data looks like XML. So parse it.
  Cxml *xml = new Cxml();
  xml->parse_string(serializedData);
  element *xml_node = xml->get_root_element();
  element* child = xml_node->get_next_child();
  element* grandChild = child->get_next_child();
  std::string out;

  // If we have been given data from a valid XML file (which has only
  // one root element), the 'child' points to the root node, which we
  // don't want to keep.  So we'll work our way through the
  // grandchildren in this loop.
  while (child != NULL) {

    // There should be only one child here, so this should only pick
    // the root name off the serial data.
    _indexName = child->get_name();

    // Now scan through the child's children for the rest of the data.
    while (grandChild != NULL) {

      out = _walkXML(grandChild, "/");

      grandChild = child->get_next_child();
    }

    child = xml_node->get_next_child();
  }

  delete xml;

  // If there are nodes in the tree with a 'linknode' attribute,
  // resolve them.
  if (_linkNeeded) {
    _linkNodes();
    _linkContent();
    _linkNeeded = false;
  }

}